

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

int xmlDictOwns(xmlDictPtr dict,xmlChar *str)

{
  int iVar1;
  xmlDictStringsPtr_conflict pxVar2;
  
  iVar1 = -1;
  if (str != (xmlChar *)0x0) {
    do {
      if (dict == (xmlDictPtr)0x0) {
        return -1;
      }
      for (pxVar2 = dict->strings; pxVar2 != (xmlDictStringsPtr_conflict)0x0; pxVar2 = pxVar2->next)
      {
        if ((pxVar2->array <= str) && (str <= pxVar2->free)) {
          return 1;
        }
      }
      dict = dict->subdict;
    } while (dict != (_xmlDict *)0x0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlDictOwns(xmlDictPtr dict, const xmlChar *str) {
    xmlDictStringsPtr pool;

    if ((dict == NULL) || (str == NULL))
	return(-1);
    pool = dict->strings;
    while (pool != NULL) {
        if ((str >= &pool->array[0]) && (str <= pool->free))
	    return(1);
	pool = pool->next;
    }
    if (dict->subdict)
        return(xmlDictOwns(dict->subdict, str));
    return(0);
}